

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Reshape_x86::forward(Reshape_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  bool bVar5;
  __m128 _v;
  int i_2;
  float *outptr_2;
  float *ptr;
  int q_1;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _row3_1;
  __m128 _row2_1;
  __m128 _row1_1;
  __m128 _row0_1;
  int i_1;
  float *outptr_1;
  float *ptr3_1;
  float *ptr2_1;
  float *ptr1_1;
  float *ptr0_1;
  int q;
  int size;
  Option opt_flatten_1;
  Mat bottom_blob_flattened_1;
  size_t out_elemsize_1;
  int out_elempack_2;
  int _c;
  int _d;
  int _h_1;
  int _w_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _row3;
  __m128 _row2;
  __m128 _row1;
  __m128 _row0;
  int j;
  float *outptr;
  float *ptr3;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int i;
  int outh;
  int outw;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  size_t out_elemsize;
  int out_elempack_1;
  int _h;
  int _w;
  int total;
  size_t elemsize;
  int dims;
  int dims_1;
  int out_elempack;
  int ret;
  Mat top_blob_unpacked;
  Mat bottom_blob_unpacked;
  Option opt_pack;
  int elempack;
  Mat *m_1;
  Mat *m;
  size_t in_stack_fffffffffffff008;
  Allocator *in_stack_fffffffffffff010;
  void **ppvVar6;
  size_t in_stack_fffffffffffff018;
  Mat *in_stack_fffffffffffff020;
  Option *in_stack_fffffffffffff028;
  Mat *in_stack_fffffffffffff030;
  int iVar7;
  Mat *in_stack_fffffffffffff038;
  Mat *in_stack_fffffffffffff040;
  int in_stack_fffffffffffff080;
  undefined4 in_stack_fffffffffffff088;
  undefined4 in_stack_fffffffffffff08c;
  undefined4 in_stack_fffffffffffff090;
  undefined4 in_stack_fffffffffffff094;
  int local_e38;
  int local_e34;
  int local_e30;
  int local_e2c;
  int local_e28;
  int local_e24;
  int local_cc0;
  int local_cbc;
  int local_c4c;
  undefined8 local_c48;
  undefined8 local_c40;
  undefined8 local_c38;
  undefined4 local_c30;
  long local_c28;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined8 local_c08;
  undefined8 *local_c00;
  undefined8 *local_bf8;
  int local_bec;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  int local_b64;
  undefined8 local_b60;
  undefined8 local_b58;
  undefined8 local_b50;
  undefined4 local_b48;
  long local_b40;
  undefined4 local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined8 local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 *local_b08;
  undefined8 *local_b00;
  undefined8 *local_af8;
  int local_af0;
  int local_aec;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  void *local_aa0;
  int *local_a98;
  long local_a90;
  undefined4 local_a88;
  long *local_a80;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  int local_a68;
  long local_a60;
  long local_a58;
  int local_a4c;
  int local_a48;
  int local_a44;
  int local_a40;
  int local_a3c;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  int local_9b4;
  undefined8 *local_9b0;
  undefined8 *local_9a8;
  undefined8 *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  int local_984;
  int local_980;
  int local_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  void *local_938;
  int *local_930;
  long local_928;
  undefined4 local_920;
  long *local_918;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined4 local_904;
  int local_900;
  long local_8f8;
  long local_8f0;
  int local_8e8;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  ulong local_8d8;
  int local_8cc;
  int local_8c8;
  undefined4 local_8c4;
  int local_8c0;
  int local_8bc;
  void *local_8b8;
  int *local_8b0;
  undefined8 local_8a8;
  undefined4 local_8a0;
  long *local_898;
  int local_890;
  int local_88c;
  int local_888;
  undefined4 local_884;
  int local_880;
  undefined8 local_878;
  void *local_860;
  int *local_858;
  undefined8 local_850;
  undefined4 local_848;
  long *local_840;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined8 local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  int local_7d4;
  undefined8 *local_7d0;
  long *local_7c8;
  long *local_7c0;
  int local_7ac;
  void **local_7a8;
  void **local_7a0;
  void **local_798;
  void **local_788;
  void **local_778;
  undefined8 *local_768;
  undefined8 *local_758;
  void **local_748;
  long *local_738;
  void **local_730;
  long *local_728;
  void **local_720;
  int local_708;
  undefined4 local_704;
  long *local_700;
  long *local_6f8;
  int local_6e8;
  undefined4 local_6e4;
  long *local_6e0;
  long *local_6d8;
  int local_6c8;
  undefined4 local_6c4;
  long *local_6c0;
  void **local_6a0;
  long *local_698;
  void **local_690;
  void **local_688;
  void **local_680;
  void **local_678;
  void **local_670;
  void **local_668;
  void **local_660;
  void **local_658;
  void **local_650;
  void **local_648;
  int local_63c;
  long *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  Option *in_stack_fffffffffffffa20;
  undefined4 uVar8;
  Mat *in_stack_fffffffffffffa28;
  undefined4 uVar9;
  Mat *in_stack_fffffffffffffa30;
  undefined4 uVar10;
  Reshape *in_stack_fffffffffffffa38;
  undefined4 uVar11;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined4 local_598;
  undefined4 uStack_594;
  undefined4 local_588;
  undefined4 uStack_584;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_540;
  undefined4 uStack_53c;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  
  local_7d4 = (int)in_RSI[3];
  local_7d0 = in_RCX;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1) {
    local_818 = *in_RCX;
    local_808 = in_RCX[2];
    uStack_800 = in_RCX[3];
    local_7f8 = in_RCX[4];
    uStack_7f0 = in_RCX[5];
    local_7e8 = in_RCX[6];
    uStack_7e0 = in_RCX[7];
    uStack_810 = in_RCX[2];
    local_7a8 = &local_860;
    local_860 = (void *)0x0;
    iVar7 = (int)((ulong)in_stack_fffffffffffff030 >> 0x20);
    local_858 = (int *)0x0;
    local_850 = 0;
    local_848 = 0;
    local_840 = (long *)0x0;
    local_838 = 0;
    local_834 = 0;
    local_830 = 0;
    local_82c = 0;
    local_828 = 0;
    local_820 = 0;
    convert_packing(in_stack_fffffffffffff040,in_stack_fffffffffffff038,iVar7,
                    in_stack_fffffffffffff028);
    local_7a0 = &local_8b8;
    local_8b8 = (void *)0x0;
    local_8b0 = (int *)0x0;
    local_8a8 = 0;
    local_8a0 = 0;
    local_898 = (long *)0x0;
    local_890 = 0;
    local_88c = 0;
    local_888 = 0;
    local_884 = 0;
    local_880 = 0;
    local_878 = 0;
    local_8bc = Reshape::forward(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                                 in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    local_7ac = local_8bc;
    if (local_8bc == 0) {
      local_8c4 = 1;
      if ((*(byte *)((long)local_7d0 + 0x27) & 1) != 0) {
        local_8c8 = local_890;
        if ((local_890 == 1) && (local_8c4 = 1, local_88c % 4 == 0)) {
          local_8c4 = 4;
        }
        if ((local_890 == 2) && (local_8c4 = 1, local_888 % 4 == 0)) {
          local_8c4 = 4;
        }
        if (((local_890 == 3) || (local_890 == 4)) && (local_8c4 = 1, local_880 % 4 == 0)) {
          local_8c4 = 4;
        }
      }
      convert_packing(in_stack_fffffffffffff040,in_stack_fffffffffffff038,iVar7,
                      in_stack_fffffffffffff028);
      local_7ac = 0;
    }
    local_8c0 = 1;
    local_798 = &local_8b8;
    if (local_8b0 != (int *)0x0) {
      LOCK();
      iVar7 = *local_8b0;
      *local_8b0 = *local_8b0 + -1;
      UNLOCK();
      if (iVar7 == 1) {
        if (local_898 == (long *)0x0) {
          if (local_8b8 != (void *)0x0) {
            free(local_8b8);
          }
        }
        else {
          (**(code **)(*local_898 + 0x18))(local_898,local_8b8);
        }
      }
    }
    local_8b8 = (void *)0x0;
    local_8a8 = 0;
    local_8a0 = 0;
    local_884 = 0;
    local_878 = 0;
    local_8b0 = (int *)0x0;
    local_788 = &local_860;
    if (local_858 != (int *)0x0) {
      LOCK();
      iVar7 = *local_858;
      *local_858 = *local_858 + -1;
      UNLOCK();
      if (iVar7 == 1) {
        if (local_840 == (long *)0x0) {
          if (local_860 != (void *)0x0) {
            free(local_860);
          }
        }
        else {
          (**(code **)(*local_840 + 0x18))(local_840,local_860);
        }
      }
    }
  }
  else {
    local_7c8 = in_RDX;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1) {
      flatten(in_stack_fffffffffffff040,in_stack_fffffffffffff038,
              (Option *)in_stack_fffffffffffff030);
      bVar5 = true;
      if (*local_7c8 != 0) {
        bVar5 = local_7c8[8] * (long)(int)local_7c8[7] == 0;
      }
      if (bVar5) {
        local_7ac = -100;
      }
      else {
        local_7ac = 0;
      }
    }
    else {
      local_8cc = (int)in_RSI[5];
      local_8d8 = in_RSI[2];
      local_8dc = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
                  (int)in_RSI[7] * local_7d4;
      local_7c0 = in_RSI;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2) {
        local_8e0 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_8e4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        if (local_8e0 == 0) {
          if (local_8cc == 1) {
            local_cbc = *(int *)((long)in_RSI + 0x2c) * local_7d4;
          }
          else {
            local_cbc = *(int *)((long)in_RSI + 0x2c);
          }
          local_8e0 = local_cbc;
        }
        if (local_8e4 == 0) {
          if (local_8cc == 2) {
            local_cc0 = (int)in_RSI[6] * local_7d4;
          }
          else {
            local_cc0 = (int)in_RSI[6];
          }
          local_8e4 = local_cc0;
        }
        if (local_8e0 == -1) {
          local_8e0 = local_8dc / local_8e4;
        }
        if (local_8e4 == -1) {
          local_8e4 = local_8dc / local_8e0;
        }
        local_8e8 = 1;
        if (((*(byte *)((long)in_RCX + 0x27) & 1) != 0) && (local_8e8 = 1, local_8e4 % 4 == 0)) {
          local_8e8 = 4;
        }
        local_8f0 = (local_8d8 / (ulong)(long)local_7d4) * (long)local_8e8;
        if (((local_8cc == 2) && ((int)in_RSI[6] * local_7d4 == local_8e4)) &&
           (local_7d4 == local_8e8)) {
          if (in_RDX != in_RSI) {
            if (in_RSI[1] != 0) {
              piVar1 = (int *)in_RSI[1];
              local_6c4 = 1;
              LOCK();
              local_6c8 = *piVar1;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            local_6c0 = in_RSI;
            if (in_RDX[1] != 0) {
              piVar1 = (int *)in_RDX[1];
              LOCK();
              iVar7 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (iVar7 == 1) {
                if (in_RDX[4] == 0) {
                  if ((void *)*in_RDX != (void *)0x0) {
                    free((void *)*in_RDX);
                  }
                }
                else {
                  (**(code **)(*(long *)in_RDX[4] + 0x18))
                            ((long *)in_RDX[4],*in_RDX,local_8d8 % (ulong)(long)local_7d4);
                }
              }
            }
            *in_RDX = 0;
            in_RDX[2] = 0;
            *(undefined4 *)(in_RDX + 3) = 0;
            *(undefined4 *)(in_RDX + 5) = 0;
            *(undefined4 *)((long)in_RDX + 0x2c) = 0;
            *(undefined4 *)(in_RDX + 6) = 0;
            *(undefined4 *)((long)in_RDX + 0x34) = 0;
            *(undefined4 *)(in_RDX + 7) = 0;
            in_RDX[8] = 0;
            in_RDX[1] = 0;
            *in_RDX = *local_6c0;
            in_RDX[1] = local_6c0[1];
            in_RDX[2] = local_6c0[2];
            *(int *)(in_RDX + 3) = (int)local_6c0[3];
            in_RDX[4] = local_6c0[4];
            *(int *)(in_RDX + 5) = (int)local_6c0[5];
            *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_6c0 + 0x2c);
            *(int *)(in_RDX + 6) = (int)local_6c0[6];
            *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_6c0 + 0x34);
            *(int *)(in_RDX + 7) = (int)local_6c0[7];
            in_RDX[8] = local_6c0[8];
          }
          return 0;
        }
        if (local_8e8 == 1) {
          flatten(in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                  (Option *)in_stack_fffffffffffff030);
          bVar5 = true;
          if (*local_7c8 != 0) {
            bVar5 = local_7c8[8] * (long)(int)local_7c8[7] == 0;
          }
          if (!bVar5) {
            *(undefined4 *)(local_7c8 + 5) = 2;
            *(int *)((long)local_7c8 + 0x2c) = local_8e0;
            *(int *)(local_7c8 + 6) = local_8e4;
            local_7c8[8] = (long)local_8e0 * (long)local_8e4;
            local_7c8[2] = local_8f0;
            *(int *)(local_7c8 + 3) = local_8e8;
            return 0;
          }
          return -100;
        }
        local_6a0 = &local_938;
        local_938 = (void *)*in_RSI;
        local_930 = (int *)in_RSI[1];
        local_928 = in_RSI[2];
        local_920 = (undefined4)in_RSI[3];
        local_918 = (long *)in_RSI[4];
        local_910 = (undefined4)in_RSI[5];
        local_90c = *(undefined4 *)((long)in_RSI + 0x2c);
        local_908 = (undefined4)in_RSI[6];
        local_904 = *(undefined4 *)((long)in_RSI + 0x34);
        local_900 = (int)in_RSI[7];
        local_8f8 = in_RSI[8];
        if (local_930 != (int *)0x0) {
          LOCK();
          *local_930 = *local_930 + 1;
          UNLOCK();
        }
        local_978 = *in_RCX;
        local_968 = in_RCX[2];
        uStack_960 = in_RCX[3];
        local_958 = in_RCX[4];
        uStack_950 = in_RCX[5];
        local_948 = in_RCX[6];
        uStack_940 = in_RCX[7];
        uStack_970 = in_RCX[2];
        flatten(in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                (Option *)in_stack_fffffffffffff030);
        local_720 = &local_938;
        if (local_938 == (void *)0x0 || local_8f8 * local_900 == 0) {
          local_7ac = -100;
          local_8c0 = 1;
        }
        else {
          Mat::create(in_stack_fffffffffffff030,(int)((ulong)in_stack_fffffffffffff028 >> 0x20),
                      (int)in_stack_fffffffffffff028,(size_t)in_stack_fffffffffffff020,
                      (int)(in_stack_fffffffffffff018 >> 0x20),in_stack_fffffffffffff010);
          local_728 = local_7c8;
          bVar5 = true;
          if (*local_7c8 != 0) {
            bVar5 = local_7c8[8] * (long)(int)local_7c8[7] == 0;
          }
          if (bVar5) {
            local_7ac = -100;
            local_8c0 = 1;
          }
          else {
            local_97c = *(int *)((long)local_7c8 + 0x2c);
            local_980 = (int)local_7c8[6];
            if (local_8e8 == 4) {
              for (local_984 = 0; local_984 < local_980; local_984 = local_984 + 1) {
                local_648 = &local_938;
                local_990 = (undefined8 *)((long)local_938 + (long)(local_97c * local_984 * 4) * 4);
                local_650 = &local_938;
                local_998 = (undefined8 *)
                            ((long)local_938 + (long)(local_97c * (local_984 * 4 + 1)) * 4);
                local_658 = &local_938;
                local_9a0 = (undefined8 *)
                            ((long)local_938 + (long)(local_97c * (local_984 * 4 + 2)) * 4);
                local_660 = &local_938;
                local_9a8 = (undefined8 *)
                            ((long)local_938 + (long)(local_97c * (local_984 * 4 + 3)) * 4);
                local_638 = local_7c8;
                local_63c = local_984;
                local_9b0 = (undefined8 *)
                            (*local_7c8 +
                            (long)*(int *)((long)local_7c8 + 0x2c) * (long)local_984 * local_7c8[2])
                ;
                for (local_9b4 = 0; local_9b4 + 3 < local_97c; local_9b4 = local_9b4 + 4) {
                  local_5f0 = local_990;
                  local_5f8 = local_998;
                  local_600 = local_9a0;
                  local_608 = local_9a8;
                  local_578 = (undefined4)*local_990;
                  uStack_574 = (undefined4)((ulong)*local_990 >> 0x20);
                  local_588 = (undefined4)*local_998;
                  uStack_584 = (undefined4)((ulong)*local_998 >> 0x20);
                  local_a38 = CONCAT44(local_588,local_578);
                  uStack_a30 = CONCAT44(uStack_584,uStack_574);
                  local_598 = (undefined4)*local_9a0;
                  uStack_594 = (undefined4)((ulong)*local_9a0 >> 0x20);
                  local_5a8 = (undefined4)*local_9a8;
                  uStack_5a4 = (undefined4)((ulong)*local_9a8 >> 0x20);
                  local_a18 = CONCAT44(local_5a8,local_598);
                  uStack_a10 = CONCAT44(uStack_5a4,uStack_594);
                  uStack_4f0 = (undefined4)local_990[1];
                  uStack_4ec = (undefined4)((ulong)local_990[1] >> 0x20);
                  uStack_500 = (undefined4)local_998[1];
                  uStack_4fc = (undefined4)((ulong)local_998[1] >> 0x20);
                  local_a28 = CONCAT44(uStack_500,uStack_4f0);
                  uStack_a20 = CONCAT44(uStack_4fc,uStack_4ec);
                  uStack_510 = (undefined4)local_9a0[1];
                  uStack_50c = (undefined4)((ulong)local_9a0[1] >> 0x20);
                  uStack_520 = (undefined4)local_9a8[1];
                  uStack_51c = (undefined4)((ulong)local_9a8[1] >> 0x20);
                  local_a08 = CONCAT44(uStack_520,uStack_510);
                  uStack_a00 = CONCAT44(uStack_51c,uStack_50c);
                  local_9c8 = CONCAT44(local_588,local_578);
                  uStack_9c0 = CONCAT44(local_5a8,local_598);
                  local_9d8 = CONCAT44(uStack_584,uStack_574);
                  uStack_9d0 = CONCAT44(uStack_5a4,uStack_594);
                  local_9e8 = CONCAT44(uStack_500,uStack_4f0);
                  uStack_9e0 = CONCAT44(uStack_520,uStack_510);
                  local_9f8 = CONCAT44(uStack_4fc,uStack_4ec);
                  uStack_9f0 = CONCAT44(uStack_51c,uStack_50c);
                  *local_9b0 = local_9c8;
                  local_9b0[1] = uStack_9c0;
                  local_9b0[2] = local_9d8;
                  local_9b0[3] = uStack_9d0;
                  local_9b0[4] = local_9e8;
                  local_9b0[5] = uStack_9e0;
                  local_9b0[6] = local_9f8;
                  local_9b0[7] = uStack_9f0;
                  local_990 = local_990 + 2;
                  local_998 = local_998 + 2;
                  local_9a0 = local_9a0 + 2;
                  local_9a8 = local_9a8 + 2;
                  local_9b0 = local_9b0 + 8;
                }
                for (; local_9b4 < local_97c; local_9b4 = local_9b4 + 1) {
                  *(undefined4 *)local_9b0 = *(undefined4 *)local_990;
                  *(undefined4 *)((long)local_9b0 + 4) = *(undefined4 *)local_998;
                  *(undefined4 *)(local_9b0 + 1) = *(undefined4 *)local_9a0;
                  *(undefined4 *)((long)local_9b0 + 0xc) = *(undefined4 *)local_9a8;
                  local_9b0 = local_9b0 + 2;
                  local_9a8 = (undefined8 *)((long)local_9a8 + 4);
                  local_9a0 = (undefined8 *)((long)local_9a0 + 4);
                  local_998 = (undefined8 *)((long)local_998 + 4);
                  local_990 = (undefined8 *)((long)local_990 + 4);
                }
              }
            }
            local_8c0 = 0;
          }
        }
        local_778 = &local_938;
        if (local_930 != (int *)0x0) {
          LOCK();
          iVar7 = *local_930;
          *local_930 = *local_930 + -1;
          UNLOCK();
          if (iVar7 == 1) {
            if (local_918 == (long *)0x0) {
              if (local_938 != (void *)0x0) {
                free(local_938);
              }
            }
            else {
              (**(code **)(*local_918 + 0x18))(local_918,local_938);
            }
          }
        }
        local_938 = (void *)0x0;
        local_928 = 0;
        local_920 = 0;
        local_910 = 0;
        local_90c = 0;
        local_908 = 0;
        local_904 = 0;
        local_900 = 0;
        local_8f8 = 0;
        local_930 = (int *)0x0;
        if (local_8c0 != 0) {
          return local_7ac;
        }
      }
      plVar4 = local_7c8;
      if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 3) ||
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 4)) {
        local_a3c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_a40 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_a44 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
        local_a48 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 3) {
          if (local_a3c == 0) {
            if (local_8cc == 1) {
              local_e24 = *(int *)((long)local_7c0 + 0x2c) * local_7d4;
            }
            else {
              local_e24 = *(int *)((long)local_7c0 + 0x2c);
            }
            local_a3c = local_e24;
          }
          if (local_a40 == 0) {
            if (local_8cc == 2) {
              local_e28 = (int)local_7c0[6] * local_7d4;
            }
            else {
              local_e28 = (int)local_7c0[6];
            }
            local_a40 = local_e28;
          }
          if (local_a48 == 0) {
            if (local_8cc == 3) {
              local_e2c = (int)local_7c0[7] * local_7d4;
            }
            else {
              local_e2c = (int)local_7c0[7];
            }
            local_a48 = local_e2c;
          }
          if (local_a3c == -1) {
            local_a3c = (int)((long)((ulong)(uint)((int)((long)local_8dc / (long)local_a48) >> 0x1f)
                                     << 0x20 | (long)local_8dc / (long)local_a48 & 0xffffffffU) /
                             (long)local_a40);
          }
          if (local_a40 == -1) {
            local_a40 = (int)((long)((ulong)(uint)((int)((long)local_8dc / (long)local_a48) >> 0x1f)
                                     << 0x20 | (long)local_8dc / (long)local_a48 & 0xffffffffU) /
                             (long)local_a3c);
          }
          if (local_a48 == -1) {
            local_a48 = (int)((long)((ulong)(uint)((int)((long)local_8dc / (long)local_a40) >> 0x1f)
                                     << 0x20 | (long)local_8dc / (long)local_a40 & 0xffffffffU) /
                             (long)local_a3c);
          }
        }
        else {
          if (local_a3c == 0) {
            if (local_8cc == 1) {
              local_e30 = *(int *)((long)local_7c0 + 0x2c) * local_7d4;
            }
            else {
              local_e30 = *(int *)((long)local_7c0 + 0x2c);
            }
            local_a3c = local_e30;
          }
          if (local_a40 == 0) {
            if (local_8cc == 2) {
              local_e34 = (int)local_7c0[6] * local_7d4;
            }
            else {
              local_e34 = (int)local_7c0[6];
            }
            local_a40 = local_e34;
          }
          if (local_a44 == 0) {
            local_a44 = *(int *)((long)local_7c0 + 0x34);
          }
          if (local_a48 == 0) {
            if ((local_8cc == 3) || (local_8cc == 4)) {
              local_e38 = (int)local_7c0[7] * local_7d4;
            }
            else {
              local_e38 = (int)local_7c0[7];
            }
            local_a48 = local_e38;
          }
          if (local_a3c == -1) {
            uVar2 = (long)((ulong)(uint)((int)((long)local_8dc / (long)local_a48) >> 0x1f) << 0x20 |
                          (long)local_8dc / (long)local_a48 & 0xffffffffU) / (long)local_a44;
            local_a3c = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)local_a40);
          }
          if (local_a40 == -1) {
            uVar2 = (long)((ulong)(uint)((int)((long)local_8dc / (long)local_a48) >> 0x1f) << 0x20 |
                          (long)local_8dc / (long)local_a48 & 0xffffffffU) / (long)local_a44;
            local_a40 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)local_a3c);
          }
          if (local_a44 == -1) {
            uVar2 = (long)((ulong)(uint)((int)((long)local_8dc / (long)local_a48) >> 0x1f) << 0x20 |
                          (long)local_8dc / (long)local_a48 & 0xffffffffU) / (long)local_a40;
            local_a44 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)local_a3c);
          }
          if (local_a48 == -1) {
            uVar2 = (long)((ulong)(uint)((int)((long)local_8dc / (long)local_a44) >> 0x1f) << 0x20 |
                          (long)local_8dc / (long)local_a44 & 0xffffffffU) / (long)local_a40;
            local_a48 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)local_a3c);
          }
        }
        local_a4c = 1;
        if (((*(byte *)((long)local_7d0 + 0x27) & 1) != 0) && (local_a4c = 1, local_a48 % 4 == 0)) {
          local_a4c = 4;
        }
        local_a58 = (local_8d8 / (ulong)(long)local_7d4) * (long)local_a4c;
        if (((local_8cc == 3) && ((int)local_7c0[7] * local_7d4 == local_a48)) &&
           (local_7d4 == local_a4c)) {
          local_6d8 = local_7c8;
          local_6e0 = local_7c0;
          if (local_7c8 != local_7c0) {
            if (local_7c0[1] != 0) {
              piVar1 = (int *)local_7c0[1];
              local_6e4 = 1;
              LOCK();
              local_6e8 = *piVar1;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            if (local_7c8[1] != 0) {
              piVar1 = (int *)local_7c8[1];
              LOCK();
              iVar7 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (iVar7 == 1) {
                if (local_7c8[4] == 0) {
                  if ((void *)*local_7c8 != (void *)0x0) {
                    free((void *)*local_7c8);
                  }
                }
                else {
                  (**(code **)(*(long *)local_7c8[4] + 0x18))((long *)local_7c8[4],*local_7c8);
                }
              }
            }
            *plVar4 = 0;
            plVar4[2] = 0;
            *(undefined4 *)(plVar4 + 3) = 0;
            *(undefined4 *)(plVar4 + 5) = 0;
            *(undefined4 *)((long)plVar4 + 0x2c) = 0;
            *(undefined4 *)(plVar4 + 6) = 0;
            *(undefined4 *)((long)plVar4 + 0x34) = 0;
            *(undefined4 *)(plVar4 + 7) = 0;
            plVar4[8] = 0;
            plVar4[1] = 0;
            *plVar4 = *local_6e0;
            plVar4[1] = local_6e0[1];
            plVar4[2] = local_6e0[2];
            *(int *)(plVar4 + 3) = (int)local_6e0[3];
            plVar4[4] = local_6e0[4];
            *(int *)(plVar4 + 5) = (int)local_6e0[5];
            *(undefined4 *)((long)plVar4 + 0x2c) = *(undefined4 *)((long)local_6e0 + 0x2c);
            *(int *)(plVar4 + 6) = (int)local_6e0[6];
            *(undefined4 *)((long)plVar4 + 0x34) = *(undefined4 *)((long)local_6e0 + 0x34);
            *(int *)(plVar4 + 7) = (int)local_6e0[7];
            plVar4[8] = local_6e0[8];
          }
          *(int *)((long)local_7c8 + 0x2c) = local_a3c;
          *(int *)(local_7c8 + 6) = local_a40;
          return 0;
        }
        if (((local_8cc == 4) && ((int)local_7c0[7] * local_7d4 == local_a48)) &&
           (local_7d4 == local_a4c)) {
          local_6f8 = local_7c8;
          local_700 = local_7c0;
          if (local_7c8 != local_7c0) {
            if (local_7c0[1] != 0) {
              piVar1 = (int *)local_7c0[1];
              local_704 = 1;
              LOCK();
              local_708 = *piVar1;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            if (local_7c8[1] != 0) {
              piVar1 = (int *)local_7c8[1];
              LOCK();
              iVar7 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (iVar7 == 1) {
                if (local_7c8[4] == 0) {
                  if ((void *)*local_7c8 != (void *)0x0) {
                    free((void *)*local_7c8);
                  }
                }
                else {
                  (**(code **)(*(long *)local_7c8[4] + 0x18))
                            ((long *)local_7c8[4],*local_7c8,local_8d8 % (ulong)(long)local_7d4);
                }
              }
            }
            *plVar4 = 0;
            plVar4[2] = 0;
            *(undefined4 *)(plVar4 + 3) = 0;
            *(undefined4 *)(plVar4 + 5) = 0;
            *(undefined4 *)((long)plVar4 + 0x2c) = 0;
            *(undefined4 *)(plVar4 + 6) = 0;
            *(undefined4 *)((long)plVar4 + 0x34) = 0;
            *(undefined4 *)(plVar4 + 7) = 0;
            plVar4[8] = 0;
            plVar4[1] = 0;
            *plVar4 = *local_700;
            plVar4[1] = local_700[1];
            plVar4[2] = local_700[2];
            *(int *)(plVar4 + 3) = (int)local_700[3];
            plVar4[4] = local_700[4];
            *(int *)(plVar4 + 5) = (int)local_700[5];
            *(undefined4 *)((long)plVar4 + 0x2c) = *(undefined4 *)((long)local_700 + 0x2c);
            *(int *)(plVar4 + 6) = (int)local_700[6];
            *(undefined4 *)((long)plVar4 + 0x34) = *(undefined4 *)((long)local_700 + 0x34);
            *(int *)(plVar4 + 7) = (int)local_700[7];
            plVar4[8] = local_700[8];
          }
          *(int *)((long)local_7c8 + 0x2c) = local_a3c;
          *(int *)(local_7c8 + 6) = local_a40;
          *(int *)((long)local_7c8 + 0x34) = local_a44;
          return 0;
        }
        local_690 = &local_aa0;
        local_698 = local_7c0;
        local_aa0 = (void *)*local_7c0;
        local_a98 = (int *)local_7c0[1];
        local_a90 = local_7c0[2];
        local_a88 = (undefined4)local_7c0[3];
        local_a80 = (long *)local_7c0[4];
        local_a78 = (undefined4)local_7c0[5];
        local_a74 = *(undefined4 *)((long)local_7c0 + 0x2c);
        local_a70 = (undefined4)local_7c0[6];
        local_a6c = *(undefined4 *)((long)local_7c0 + 0x34);
        local_a68 = (int)local_7c0[7];
        local_a60 = local_7c0[8];
        if (local_a98 != (int *)0x0) {
          LOCK();
          *local_a98 = *local_a98 + 1;
          UNLOCK();
        }
        local_ae8 = *local_7d0;
        local_ad8 = local_7d0[2];
        uStack_ad0 = local_7d0[3];
        local_ac8 = local_7d0[4];
        uStack_ac0 = local_7d0[5];
        local_ab8 = local_7d0[6];
        uStack_ab0 = local_7d0[7];
        uStack_ae0 = local_7d0[2];
        flatten(in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                (Option *)in_stack_fffffffffffff030);
        local_730 = &local_aa0;
        if (local_aa0 == (void *)0x0 || local_a60 * local_a68 == 0) {
          local_7ac = -100;
          local_8c0 = 1;
        }
        else {
          iVar7 = (int)((ulong)in_stack_fffffffffffff010 >> 0x20);
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 3) {
            Mat::create(in_stack_fffffffffffff030,(int)((ulong)in_stack_fffffffffffff028 >> 0x20),
                        (int)in_stack_fffffffffffff028,
                        (int)((ulong)in_stack_fffffffffffff020 >> 0x20),in_stack_fffffffffffff018,
                        iVar7,(Allocator *)
                              CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090));
          }
          else {
            Mat::create(in_stack_fffffffffffff020,(int)(in_stack_fffffffffffff018 >> 0x20),
                        (int)in_stack_fffffffffffff018,iVar7,(int)in_stack_fffffffffffff010,
                        in_stack_fffffffffffff008,in_stack_fffffffffffff080,
                        (Allocator *)CONCAT44(in_stack_fffffffffffff08c,in_stack_fffffffffffff088));
          }
          local_738 = local_7c8;
          bVar5 = true;
          if (*local_7c8 != 0) {
            bVar5 = local_7c8[8] * (long)(int)local_7c8[7] == 0;
          }
          if (bVar5) {
            local_7ac = -100;
            local_8c0 = 1;
          }
          else {
            local_aec = *(int *)((long)local_7c8 + 0x2c) * (int)local_7c8[6] *
                        *(int *)((long)local_7c8 + 0x34);
            if (local_a4c == 4) {
              for (local_af0 = 0; local_af0 < (int)local_7c8[7]; local_af0 = local_af0 + 1) {
                local_668 = &local_aa0;
                local_af8 = (undefined8 *)((long)local_aa0 + (long)(local_aec * local_af0 * 4) * 4);
                local_670 = &local_aa0;
                local_b00 = (undefined8 *)
                            ((long)local_aa0 + (long)(local_aec * (local_af0 * 4 + 1)) * 4);
                local_678 = &local_aa0;
                local_b08 = (undefined8 *)
                            ((long)local_aa0 + (long)(local_aec * (local_af0 * 4 + 2)) * 4);
                local_680 = &local_aa0;
                local_b10 = (undefined8 *)
                            ((long)local_aa0 + (long)(local_aec * (local_af0 * 4 + 3)) * 4);
                local_b18 = (undefined8 *)
                            (*local_7c8 + local_7c8[8] * (long)local_af0 * local_7c8[2]);
                local_b40 = local_7c8[4];
                local_768 = &local_b60;
                local_b60 = 0;
                local_b50 = 0;
                local_b48 = 0;
                local_b38 = 0;
                local_b34 = 0;
                local_b30 = 0;
                local_b2c = 0;
                local_b28 = 0;
                local_b20 = 0;
                local_b58 = 0;
                for (local_b64 = 0; local_b64 + 3 < local_aec; local_b64 = local_b64 + 4) {
                  local_610 = local_af8;
                  local_618 = local_b00;
                  local_620 = local_b08;
                  local_628 = local_b10;
                  uVar3 = *local_b10;
                  local_5b8 = (undefined4)*local_af8;
                  uStack_5b4 = (undefined4)((ulong)*local_af8 >> 0x20);
                  uVar10 = (undefined4)*local_b00;
                  uVar11 = (undefined4)((ulong)*local_b00 >> 0x20);
                  local_be8 = CONCAT44(uVar10,local_5b8);
                  uStack_be0 = CONCAT44(uVar11,uStack_5b4);
                  uVar8 = (undefined4)*local_b08;
                  uVar9 = (undefined4)((ulong)*local_b08 >> 0x20);
                  local_5e8._0_4_ = (undefined4)uVar3;
                  local_5e8._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                  local_bc8 = CONCAT44((undefined4)local_5e8,uVar8);
                  uStack_bc0 = CONCAT44(local_5e8._4_4_,uVar9);
                  uStack_530 = (undefined4)local_af8[1];
                  uStack_52c = (undefined4)((ulong)local_af8[1] >> 0x20);
                  uStack_540 = (undefined4)local_b00[1];
                  uStack_53c = (undefined4)((ulong)local_b00[1] >> 0x20);
                  local_bd8 = CONCAT44(uStack_540,uStack_530);
                  uStack_bd0 = CONCAT44(uStack_53c,uStack_52c);
                  uStack_550 = (undefined4)local_b08[1];
                  uStack_54c = (undefined4)((ulong)local_b08[1] >> 0x20);
                  uStack_560 = (undefined4)local_b10[1];
                  uStack_55c = (undefined4)((ulong)local_b10[1] >> 0x20);
                  local_bb8 = CONCAT44(uStack_560,uStack_550);
                  uStack_bb0 = CONCAT44(uStack_55c,uStack_54c);
                  local_b78 = CONCAT44(uVar10,local_5b8);
                  uStack_b70 = CONCAT44((undefined4)local_5e8,uVar8);
                  local_b88 = CONCAT44(uVar11,uStack_5b4);
                  uStack_b80 = CONCAT44(local_5e8._4_4_,uVar9);
                  local_b98 = CONCAT44(uStack_540,uStack_530);
                  uStack_b90 = CONCAT44(uStack_560,uStack_550);
                  local_ba8 = CONCAT44(uStack_53c,uStack_52c);
                  uStack_ba0 = CONCAT44(uStack_55c,uStack_54c);
                  *local_b18 = local_b78;
                  local_b18[1] = uStack_b70;
                  local_b18[2] = local_b88;
                  local_b18[3] = uStack_b80;
                  local_b18[4] = local_b98;
                  local_b18[5] = uStack_b90;
                  local_b18[6] = local_ba8;
                  local_b18[7] = uStack_ba0;
                  local_af8 = local_af8 + 2;
                  local_b00 = local_b00 + 2;
                  local_b08 = local_b08 + 2;
                  local_b10 = local_b10 + 2;
                  local_b18 = local_b18 + 8;
                  local_5e8 = uVar3;
                }
                for (; local_b64 < local_aec; local_b64 = local_b64 + 1) {
                  *(undefined4 *)local_b18 = *(undefined4 *)local_af8;
                  *(undefined4 *)((long)local_b18 + 4) = *(undefined4 *)local_b00;
                  *(undefined4 *)(local_b18 + 1) = *(undefined4 *)local_b08;
                  *(undefined4 *)((long)local_b18 + 0xc) = *(undefined4 *)local_b10;
                  local_b18 = local_b18 + 2;
                  local_b10 = (undefined8 *)((long)local_b10 + 4);
                  local_b08 = (undefined8 *)((long)local_b08 + 4);
                  local_b00 = (undefined8 *)((long)local_b00 + 4);
                  local_af8 = (undefined8 *)((long)local_af8 + 4);
                }
              }
            }
            if (local_a4c == 1) {
              for (local_bec = 0; local_bec < (int)local_7c8[7]; local_bec = local_bec + 1) {
                local_688 = &local_aa0;
                local_bf8 = (undefined8 *)((long)local_aa0 + (long)(local_aec * local_bec) * 4);
                local_c00 = (undefined8 *)
                            (*local_7c8 + local_7c8[8] * (long)local_bec * local_7c8[2]);
                local_c28 = local_7c8[4];
                local_758 = &local_c48;
                local_c48 = 0;
                local_c38 = 0;
                local_c30 = 0;
                local_c20 = 0;
                local_c1c = 0;
                local_c18 = 0;
                local_c14 = 0;
                local_c10 = 0;
                local_c08 = 0;
                local_c40 = 0;
                for (local_c4c = 0; local_c4c + 3 < local_aec; local_c4c = local_c4c + 4) {
                  local_630 = local_bf8;
                  uVar3 = local_bf8[1];
                  *local_c00 = *local_bf8;
                  local_c00[1] = uVar3;
                  local_bf8 = local_bf8 + 2;
                  local_c00 = local_c00 + 2;
                }
                for (; local_c4c < local_aec; local_c4c = local_c4c + 1) {
                  *(undefined4 *)local_c00 = *(undefined4 *)local_bf8;
                  local_c00 = (undefined8 *)((long)local_c00 + 4);
                  local_bf8 = (undefined8 *)((long)local_bf8 + 4);
                }
              }
            }
            local_8c0 = 0;
          }
        }
        ppvVar6 = &local_aa0;
        if (local_a98 != (int *)0x0) {
          LOCK();
          iVar7 = *local_a98;
          *local_a98 = *local_a98 + -1;
          UNLOCK();
          if (iVar7 == 1) {
            local_748 = ppvVar6;
            if (local_a80 == (long *)0x0) {
              if (local_aa0 != (void *)0x0) {
                free(local_aa0);
              }
            }
            else {
              (**(code **)(*local_a80 + 0x18))(local_a80,local_aa0);
            }
          }
        }
        *ppvVar6 = (void *)0x0;
        ppvVar6[2] = (void *)0x0;
        *(undefined4 *)(ppvVar6 + 3) = 0;
        *(undefined4 *)(ppvVar6 + 5) = 0;
        *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
        *(undefined4 *)(ppvVar6 + 6) = 0;
        *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
        *(undefined4 *)(ppvVar6 + 7) = 0;
        ppvVar6[8] = (void *)0x0;
        ppvVar6[1] = (void *)0x0;
        if (local_8c0 != 0) {
          return local_7ac;
        }
      }
      local_7ac = 0;
    }
  }
  return local_7ac;
}

Assistant:

int Reshape_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (permute == 1)
    {
        // TODO implement permute on-the-fly
        Option opt_pack = opt;
        opt_pack.blob_allocator = opt.workspace_allocator;

        Mat bottom_blob_unpacked;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

        Mat top_blob_unpacked;
        int ret = Reshape::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
        if (ret != 0)
            return ret;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            // resolve dst_elempack
            int dims = top_blob_unpacked.dims;
#if __AVX512F__
            if (dims == 1) out_elempack = top_blob_unpacked.w % 16 == 0 ? 16 : top_blob_unpacked.w % 8 == 0 ? 8 : top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 16 == 0 ? 16 : top_blob_unpacked.h % 8 == 0 ? 8 : top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 16 == 0 ? 16 : top_blob_unpacked.c % 8 == 0 ? 8 : top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#elif __AVX__
            if (dims == 1) out_elempack = top_blob_unpacked.w % 8 == 0 ? 8 : top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 8 == 0 ? 8 : top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 8 == 0 ? 8 : top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#else
            if (dims == 1) out_elempack = top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);

        return 0;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (_h == 0)
            _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = _h % 16 == 0 ? 16 : _h % 8 == 0 ? 8 : _h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = _h % 8 == 0 ? 8 : _h % 4 == 0 ? 4 : 1;
#else
            out_elempack = _h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == _h && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.cstep = (size_t)_w * _h;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(_w, _h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int outw = top_blob.w;
        int outh = top_blob.h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + outw * (i * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + outw * (i * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + outw * (i * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + outw * (i * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + outw * (i * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + outw * (i * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + outw * (i * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + outw * (i * 16 + 15);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 15 < outw; j += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        int _w = w;
        int _h = h;
        int _d = d;
        int _c = c;

        if (ndim == 3)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_c == 0)
                _c = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _h;
            if (_h == -1)
                _h = total / _c / _w;
            if (_c == -1)
                _c = total / _h / _w;
        }
        else // if (ndim == 4)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_d == 0)
                _d = bottom_blob.d;
            if (_c == 0)
                _c = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _d / _h;
            if (_h == -1)
                _h = total / _c / _d / _w;
            if (_d == -1)
                _d = total / _c / _h / _w;
            if (_c == -1)
                _c = total / _d / _h / _w;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = _c % 16 == 0 ? 16 : _c % 8 == 0 ? 8 : _c % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = _c % 8 == 0 ? 8 : _c % 4 == 0 ? 4 : 1;
#else
            out_elempack = _c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3 && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.w = _w;
            top_blob.h = _h;
            return 0;
        }
        if (dims == 4 && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.d = _d;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(_w, _h, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(_w, _h, _d, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (out_elempack == 16)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 16;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 16 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 16 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 16 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 16 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 16 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 16 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 16 + 7);
                const float* ptr8 = (const float*)bottom_blob_flattened + size * (q * 16 + 8);
                const float* ptr9 = (const float*)bottom_blob_flattened + size * (q * 16 + 9);
                const float* ptra = (const float*)bottom_blob_flattened + size * (q * 16 + 10);
                const float* ptrb = (const float*)bottom_blob_flattened + size * (q * 16 + 11);
                const float* ptrc = (const float*)bottom_blob_flattened + size * (q * 16 + 12);
                const float* ptrd = (const float*)bottom_blob_flattened + size * (q * 16 + 13);
                const float* ptre = (const float*)bottom_blob_flattened + size * (q * 16 + 14);
                const float* ptrf = (const float*)bottom_blob_flattened + size * (q * 16 + 15);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _row0 = _mm512_loadu_ps(ptr0);
                    __m512 _row1 = _mm512_loadu_ps(ptr1);
                    __m512 _row2 = _mm512_loadu_ps(ptr2);
                    __m512 _row3 = _mm512_loadu_ps(ptr3);
                    __m512 _row4 = _mm512_loadu_ps(ptr4);
                    __m512 _row5 = _mm512_loadu_ps(ptr5);
                    __m512 _row6 = _mm512_loadu_ps(ptr6);
                    __m512 _row7 = _mm512_loadu_ps(ptr7);
                    __m512 _row8 = _mm512_loadu_ps(ptr8);
                    __m512 _row9 = _mm512_loadu_ps(ptr9);
                    __m512 _rowa = _mm512_loadu_ps(ptra);
                    __m512 _rowb = _mm512_loadu_ps(ptrb);
                    __m512 _rowc = _mm512_loadu_ps(ptrc);
                    __m512 _rowd = _mm512_loadu_ps(ptrd);
                    __m512 _rowe = _mm512_loadu_ps(ptre);
                    __m512 _rowf = _mm512_loadu_ps(ptrf);

                    transpose16_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7, _row8, _row9, _rowa, _rowb, _rowc, _rowd, _rowe, _rowf);

                    _mm512_storeu_ps(outptr, _row0);
                    _mm512_storeu_ps(outptr + 16, _row1);
                    _mm512_storeu_ps(outptr + 16 * 2, _row2);
                    _mm512_storeu_ps(outptr + 16 * 3, _row3);
                    _mm512_storeu_ps(outptr + 16 * 4, _row4);
                    _mm512_storeu_ps(outptr + 16 * 5, _row5);
                    _mm512_storeu_ps(outptr + 16 * 6, _row6);
                    _mm512_storeu_ps(outptr + 16 * 7, _row7);
                    _mm512_storeu_ps(outptr + 16 * 8, _row8);
                    _mm512_storeu_ps(outptr + 16 * 9, _row9);
                    _mm512_storeu_ps(outptr + 16 * 10, _rowa);
                    _mm512_storeu_ps(outptr + 16 * 11, _rowb);
                    _mm512_storeu_ps(outptr + 16 * 12, _rowc);
                    _mm512_storeu_ps(outptr + 16 * 13, _rowd);
                    _mm512_storeu_ps(outptr + 16 * 14, _rowe);
                    _mm512_storeu_ps(outptr + 16 * 15, _rowf);

                    ptr0 += 16;
                    ptr1 += 16;
                    ptr2 += 16;
                    ptr3 += 16;
                    ptr4 += 16;
                    ptr5 += 16;
                    ptr6 += 16;
                    ptr7 += 16;
                    ptr8 += 16;
                    ptr9 += 16;
                    ptra += 16;
                    ptrb += 16;
                    ptrc += 16;
                    ptrd += 16;
                    ptre += 16;
                    ptrf += 16;
                    outptr += 256;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;
                    outptr[8] = *ptr8++;
                    outptr[9] = *ptr9++;
                    outptr[10] = *ptra++;
                    outptr[11] = *ptrb++;
                    outptr[12] = *ptrc++;
                    outptr[13] = *ptrd++;
                    outptr[14] = *ptre++;
                    outptr[15] = *ptrf++;

                    outptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}